

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::FieldConstantName_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field)

{
  string *__lhs;
  FieldDescriptor *field_local;
  string *name;
  
  __lhs = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)this);
  std::operator+(__return_storage_ptr__,__lhs,"_FIELD_NUMBER");
  UpperString(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string FieldConstantName(const FieldDescriptor *field) {
  string name = field->name() + "_FIELD_NUMBER";
  UpperString(&name);
  return name;
}